

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImU32 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImRect display_rect;
  ImVec2 local_68;
  ImVec2 IStack_60;
  float local_54;
  ImVec2 local_50;
  ImVec4 local_48;
  ImVec2 local_38;
  
  if ((GImGui->NavId == id) &&
     ((((flags & 4U) != 0 || (GImGui->NavDisableHighlight == false)) &&
      (pIVar5 = GImGui->CurrentWindow, (pIVar5->DC).NavHideHighlightOneFrame == false)))) {
    local_54 = 0.0;
    if ((flags & 8U) == 0) {
      local_54 = (GImGui->Style).FrameRounding;
    }
    fVar1 = (pIVar5->ClipRect).Min.x;
    fVar2 = (pIVar5->ClipRect).Min.y;
    local_68.x = (bb->Min).x;
    local_68.y = (bb->Min).y;
    fVar13 = (float)(~-(uint)(fVar1 <= local_68.x) & (uint)fVar1 |
                    (uint)local_68.x & -(uint)(fVar1 <= local_68.x));
    fVar12 = (float)(~-(uint)(fVar2 <= local_68.y) & (uint)fVar2 |
                    (uint)local_68.y & -(uint)(fVar2 <= local_68.y));
    local_68.y = fVar12;
    local_68.x = fVar13;
    IStack_60.x = (bb->Max).x;
    fVar3 = (pIVar5->ClipRect).Max.x;
    fVar4 = (pIVar5->ClipRect).Max.y;
    if (fVar3 <= IStack_60.x) {
      IStack_60.x = fVar3;
    }
    IStack_60.y = (bb->Max).y;
    if (fVar4 <= IStack_60.y) {
      IStack_60.y = fVar4;
    }
    if ((flags & 1U) != 0) {
      fVar13 = fVar13 + -4.0;
      fVar12 = fVar12 + -4.0;
      local_68.y = fVar12;
      local_68.x = fVar13;
      fVar15 = IStack_60.x + 4.0;
      fVar14 = IStack_60.y + 4.0;
      IStack_60.y = fVar14;
      IStack_60.x = fVar15;
      if ((fVar4 < fVar14 || fVar3 < fVar15) || (fVar12 < fVar2 || fVar13 < fVar1)) {
        ImDrawList::PushClipRect(pIVar5->DrawList,local_68,IStack_60,false);
      }
      local_50.x = local_68.x + 1.0;
      pIVar6 = pIVar5->DrawList;
      local_50.y = local_68.y + 1.0;
      local_38.x = IStack_60.x + -1.0;
      local_38.y = IStack_60.y + -1.0;
      local_48.x = (GImGui->Style).Colors[0x33].x;
      local_48.y = (GImGui->Style).Colors[0x33].y;
      uVar7 = (GImGui->Style).Colors[0x33].z;
      uVar8 = (GImGui->Style).Colors[0x33].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar8;
      local_48.z = (float)uVar7;
      IVar11 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(pIVar6,&local_50,&local_38,IVar11,local_54,0xf,2.0);
      if ((fVar4 < fVar14 || fVar3 < fVar15) || (fVar12 < fVar2 || fVar13 < fVar1)) {
        ImDrawList::PopClipRect(pIVar5->DrawList);
      }
    }
    if ((flags & 2U) != 0) {
      pIVar6 = pIVar5->DrawList;
      local_48.x = (GImGui->Style).Colors[0x33].x;
      local_48.y = (GImGui->Style).Colors[0x33].y;
      uVar9 = (GImGui->Style).Colors[0x33].z;
      uVar10 = (GImGui->Style).Colors[0x33].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar10;
      local_48.z = (float)uVar9;
      IVar11 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(pIVar6,&local_68,&IStack_60,IVar11,local_54,-1,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}